

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_atomic_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  undefined4 in_register_00000014;
  char (*in_stack_ffffffffffffff20) [2];
  string local_c8;
  string local_98;
  string local_78;
  string local_58;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_38;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_24 = op2;
  local_20 = op1;
  op2_local = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  local_38 = ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                      &(this->super_Compiler).forced_temporaries,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&op1_local,(value_type *)CONCAT44(in_register_00000014,result_id));
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  to_non_uniform_aware_expression_abi_cxx11_(&local_78,this,op2_local);
  to_unpacked_expression_abi_cxx11_(&local_98,this,local_20,true);
  to_unpacked_expression_abi_cxx11_(&local_c8,this,local_24,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_58,(diligent_spirv_cross *)&op,(char **)0xe5b075,(char (*) [2])&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
             (char (*) [3])&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
             (char (*) [3])&local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,
             in_stack_ffffffffffffff20);
  emit_op(this,result_type_00,result_id_00,&local_58,false,false);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  Compiler::flush_all_atomic_capable_variables(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id,
                                       uint32_t op0, uint32_t op1, uint32_t op2,
                                       const char *op)
{
	forced_temporaries.insert(result_id);
	emit_op(result_type, result_id,
	        join(op, "(", to_non_uniform_aware_expression(op0), ", ",
	             to_unpacked_expression(op1), ", ", to_unpacked_expression(op2), ")"), false);
	flush_all_atomic_capable_variables();
}